

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefineDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::MacroFormalArgumentListSyntax*&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,Token *args,Token *args_1,MacroFormalArgumentListSyntax **args_2,
          TokenList *args_3)

{
  Token directive;
  DefineDirectiveSyntax *pDVar1;
  Info *in_RCX;
  undefined8 *in_RDX;
  TokenList *in_RSI;
  undefined8 in_R8;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  pDVar1 = (DefineDirectiveSyntax *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  directive.info = in_RCX;
  directive.kind = (short)in_R8;
  directive._2_1_ = (char)((ulong)in_R8 >> 0x10);
  directive.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  directive.rawLen = (int)((ulong)in_R8 >> 0x20);
  slang::syntax::DefineDirectiveSyntax::DefineDirectiveSyntax
            ((DefineDirectiveSyntax *)in_RDX[1],directive,*(Token *)&in_RSI->super_SyntaxListBase,
             (MacroFormalArgumentListSyntax *)*in_RDX,in_RSI);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }